

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::sectionNodeOf(BaseBuilder *this,SectionNode **out,uint32_t sectionId)

{
  Error EVar1;
  SectionNode **ppSVar2;
  uint in_EDX;
  undefined8 *in_RSI;
  ZoneAllocator *in_RDI;
  Error _err;
  SectionNode *node;
  Error err;
  ZoneAllocator *in_stack_ffffffffffffff98;
  SectionNode *pSVar3;
  undefined4 in_stack_ffffffffffffffa8;
  Error in_stack_ffffffffffffffac;
  BaseEmitter *in_stack_ffffffffffffffb0;
  SectionNode *pSVar4;
  undefined4 in_stack_ffffffffffffffb8;
  Error local_30;
  
  *in_RSI = 0;
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_30 = DebugUtils::errored(5);
  }
  else if (in_EDX < *(uint *)(*(long *)(in_RDI + 0x30) + 0xe0)) {
    if (*(uint *)(in_RDI + 0x180) <= in_EDX) {
      EVar1 = ZoneVector<asmjit::v1_14::SectionNode_*>::reserve
                        ((ZoneVector<asmjit::v1_14::SectionNode_*> *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI,
                         (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      if (EVar1 != 0) {
        EVar1 = BaseEmitter::reportError
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)in_RDI);
        return EVar1;
      }
      in_stack_ffffffffffffffb8 = 0;
    }
    pSVar4 = (SectionNode *)0x0;
    if (in_EDX < *(uint *)(in_RDI + 0x180)) {
      ppSVar2 = ZoneVector<asmjit::v1_14::SectionNode_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::SectionNode_*> *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (size_t)in_RDI);
      pSVar4 = *ppSVar2;
    }
    if (pSVar4 == (SectionNode *)0x0) {
      EVar1 = _newNodeT<asmjit::v1_14::SectionNode,unsigned_int&>
                        ((BaseBuilder *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),
                         (SectionNode **)0x0,
                         (uint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (EVar1 != 0) {
        return EVar1;
      }
      pSVar3 = pSVar4;
      if (*(uint *)((ZoneVector<asmjit::v1_14::SectionNode_*> *)in_RDI + 0x180) <= in_EDX) {
        ZoneVector<asmjit::v1_14::SectionNode_*>::resize
                  ((ZoneVector<asmjit::v1_14::SectionNode_*> *)in_RDI,in_stack_ffffffffffffff98,0);
        pSVar3 = pSVar4;
      }
      pSVar4 = pSVar3;
      ppSVar2 = ZoneVector<asmjit::v1_14::SectionNode_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::SectionNode_*> *)
                           CONCAT44(EVar1,in_stack_ffffffffffffffa8),(size_t)in_RDI);
      *ppSVar2 = pSVar3;
    }
    *in_RSI = pSVar4;
    local_30 = 0;
  }
  else {
    DebugUtils::errored(0x13);
    local_30 = BaseEmitter::reportError
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)in_RDI);
  }
  return local_30;
}

Assistant:

Error BaseBuilder::sectionNodeOf(SectionNode** out, uint32_t sectionId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!_code->isSectionValid(sectionId)))
    return reportError(DebugUtils::errored(kErrorInvalidSection));

  if (sectionId >= _sectionNodes.size()) {
    Error err = _sectionNodes.reserve(&_allocator, sectionId + 1);
    if (ASMJIT_UNLIKELY(err != kErrorOk))
      return reportError(err);
  }

  SectionNode* node = nullptr;
  if (sectionId < _sectionNodes.size())
    node = _sectionNodes[sectionId];

  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<SectionNode>(&node, sectionId));

    // We have already reserved enough space, this cannot fail now.
    if (sectionId >= _sectionNodes.size())
      _sectionNodes.resize(&_allocator, sectionId + 1);

    _sectionNodes[sectionId] = node;
  }

  *out = node;
  return kErrorOk;
}